

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O1

void Macro_smpsVcTotalLevel(uint arg_count,long *arg_array)

{
  byte bVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  uint *puVar10;
  uint *puVar11;
  uint *puVar12;
  uint *puVar13;
  uint *puVar14;
  uint *puVar15;
  uint *puVar16;
  bool bVar17;
  
  if (arg_count < 4) {
    __assert_fail("arg_count >= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                  ,0x549,"void Macro_smpsVcTotalLevel(unsigned int, long *)");
  }
  vcTL1 = (uint)*arg_array;
  vcTL2 = *(uint *)(arg_array + 1);
  vcTL3 = *(uint *)(arg_array + 2);
  vcTL4 = *(uint *)(arg_array + 3);
  MemoryStream_WriteByte
            (output_stream,(char)(vcUnusedBits << 6) + (char)vcFeedback * '\b' + (char)vcAlgorithm);
  if (target_smps2asm_version == 0) {
    vcTLMask4 = (uint)(vcAlgorithm == 7) << 7;
    vcTLMask3 = (uint)(3 < vcAlgorithm) << 7;
    vcTLMask2 = (uint)(4 < vcAlgorithm) << 7;
  }
  else {
    vcTLMask2 = 0;
    vcTLMask4 = 0;
    vcTLMask3 = 0;
  }
  vcTLMask1 = target_smps2asm_version == 0;
  if (source_driver < 3 && 2 < target_driver) {
    vcTLMask4 = (uint)(vcAlgorithm == 7) << 7;
    vcTLMask3 = (uint)(3 < vcAlgorithm) << 7;
    vcTL1 = vcTL1 & 0x7f;
    vcTLMask2 = (uint)(4 < vcAlgorithm) << 7;
    vcTL2 = vcTL2 & 0x7f;
    vcTL3 = vcTL3 & 0x7f;
    vcTLMask1 = '\x01';
    vcTL4 = vcTL4 & 0x7f;
  }
  else if ((2 < source_driver && target_driver < 3) &&
          (((((vcTL1 & 0x80) != 0 || (((byte)vcTL2 >> 7 & 4 < vcAlgorithm) != 0)) ||
            (((byte)vcTL3 >> 7 & 3 < vcAlgorithm) != 0)) ||
           ((vcAlgorithm == 7 & (byte)vcTL4 >> 7) == 1)))) {
    printf("Warning: Voice 0x%X has TL bits that do not match its algorithm setting. This voice will not work in S1/S2 drivers.\n"
           ,(ulong)current_voice);
  }
  uVar2 = target_driver;
  MemoryStream_WriteByte(output_stream,(char)(vcDT4 << 4) + (char)vcCF4);
  bVar17 = uVar2 == 2;
  puVar6 = &vcDT2;
  puVar3 = &vcDT3;
  if (bVar17) {
    puVar3 = &vcDT2;
  }
  puVar5 = &vcCF2;
  puVar4 = &vcCF3;
  if (bVar17) {
    puVar4 = &vcCF2;
    puVar6 = &vcDT3;
    puVar5 = &vcCF3;
  }
  puVar16 = &vcRS2;
  puVar7 = &vcRS3;
  if (bVar17) {
    puVar7 = &vcRS2;
  }
  puVar15 = &vcAR2;
  puVar11 = &vcAR3;
  if (bVar17) {
    puVar11 = &vcAR2;
    puVar16 = &vcRS3;
    puVar15 = &vcAR3;
  }
  puVar8 = &vcD2R2;
  puVar12 = &vcD2R3;
  if (bVar17) {
    puVar12 = &vcD2R2;
    puVar8 = &vcD2R3;
  }
  puVar9 = &vcDL2;
  puVar13 = &vcDL3;
  if (bVar17) {
    puVar13 = &vcDL2;
  }
  puVar14 = &vcRR2;
  if (bVar17) {
    puVar9 = &vcDL3;
  }
  puVar10 = &vcRR3;
  if (bVar17) {
    puVar10 = &vcRR2;
    puVar14 = &vcRR3;
  }
  MemoryStream_WriteByte(output_stream,(char)(*puVar3 << 4) + (char)*puVar4);
  MemoryStream_WriteByte(output_stream,(char)(*puVar6 << 4) + (char)*puVar5);
  MemoryStream_WriteByte(output_stream,(char)(vcDT1 << 4) + (char)vcCF1);
  MemoryStream_WriteByte(output_stream,(char)(vcRS4 << 6) + (char)vcAR4);
  MemoryStream_WriteByte(output_stream,(char)(*puVar7 << 6) + (char)*puVar11);
  MemoryStream_WriteByte(output_stream,(char)(*puVar16 << 6) + (char)*puVar15);
  MemoryStream_WriteByte(output_stream,(char)(vcRS1 << 6) + (char)vcAR1);
  MemoryStream_WriteByte(output_stream,(byte)vcD1R4Unk | (byte)vcD1R4 | (byte)vcAM4);
  bVar1 = (byte)vcD1R3 | (byte)vcAM3 | (byte)vcD1R3Unk;
  if (uVar2 == 2) {
    bVar1 = (byte)vcD1R2 | (byte)vcAM2 | (byte)vcD1R2Unk;
  }
  MemoryStream_WriteByte(output_stream,bVar1);
  bVar1 = (byte)vcD1R2 | (byte)vcAM2 | (byte)vcD1R2Unk;
  if (uVar2 == 2) {
    bVar1 = (byte)vcD1R3 | (byte)vcAM3 | (byte)vcD1R3Unk;
  }
  MemoryStream_WriteByte(output_stream,bVar1);
  MemoryStream_WriteByte(output_stream,(byte)vcD1R1Unk | (byte)vcD1R1 | (byte)vcAM1);
  MemoryStream_WriteByte(output_stream,(uchar)vcD2R4);
  MemoryStream_WriteByte(output_stream,(uchar)*puVar12);
  MemoryStream_WriteByte(output_stream,(uchar)*puVar8);
  MemoryStream_WriteByte(output_stream,(uchar)vcD2R1);
  MemoryStream_WriteByte(output_stream,(char)(vcDL4 << 4) + (char)vcRR4);
  MemoryStream_WriteByte(output_stream,(char)(*puVar13 << 4) + (char)*puVar10);
  MemoryStream_WriteByte(output_stream,(char)(*puVar9 << 4) + (char)*puVar14);
  MemoryStream_WriteByte(output_stream,(char)(vcDL1 << 4) + (char)vcRR1);
  MemoryStream_WriteByte(output_stream,(byte)vcTLMask4 | (byte)vcTL4);
  bVar1 = (byte)vcTLMask3 | (byte)vcTL3;
  if (uVar2 == 2) {
    bVar1 = (byte)vcTLMask2 | (byte)vcTL2;
  }
  MemoryStream_WriteByte(output_stream,bVar1);
  bVar1 = (byte)vcTLMask2 | (byte)vcTL2;
  if (uVar2 == 2) {
    bVar1 = (byte)vcTLMask3 | (byte)vcTL3;
  }
  MemoryStream_WriteByte(output_stream,bVar1);
  MemoryStream_WriteByte(output_stream,vcTLMask1 << 7 | (byte)vcTL1);
  current_voice = current_voice + 1;
  return;
}

Assistant:

static void Macro_smpsVcTotalLevel(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 4);

	vcTL1 = arg_array[0];
	vcTL2 = arg_array[1];
	vcTL3 = arg_array[2];
	vcTL4 = arg_array[3];

	WriteByte((vcUnusedBits << 6) + (vcFeedback << 3) + vcAlgorithm);

	if (target_smps2asm_version == 0)
	{
		vcTLMask4 = ((vcAlgorithm == 7) << 7);
		vcTLMask3 = ((vcAlgorithm >= 4) << 7);
		vcTLMask2 = ((vcAlgorithm >= 5) << 7);
		vcTLMask1 = 0x80;
	}
	else
	{
		vcTLMask4 = 0;
		vcTLMask3 = 0;
		vcTLMask2 = 0;
		vcTLMask1 = 0;
	}

	if (target_driver >= 3 && source_driver < 3)
	{
		vcTLMask4 = ((vcAlgorithm == 7) << 7);
		vcTLMask3 = ((vcAlgorithm >= 4) << 7);
		vcTLMask2 = ((vcAlgorithm >= 5) << 7);
		vcTLMask1 = 0x80;

		vcTL1 &= 0x7F;
		vcTL2 &= 0x7F;
		vcTL3 &= 0x7F;
		vcTL4 &= 0x7F;
	}
	else if (target_driver < 3 && source_driver >= 3 && ((vcTL1 & 0x80) || (vcTL2 & 0x80 && vcAlgorithm >= 5) || (vcTL3 & 0x80 && vcAlgorithm >= 4) || (vcTL4 & 0x80 && vcAlgorithm == 7)))
	{
		printf("Warning: Voice 0x%X has TL bits that do not match its algorithm setting. This voice will not work in S1/S2 drivers.\n", current_voice);
	}

	if (target_driver == 2)
	{
		WriteByte((vcDT4<<4)+vcCF4);
		WriteByte((vcDT2<<4)+vcCF2);
		WriteByte((vcDT3<<4)+vcCF3);
		WriteByte((vcDT1<<4)+vcCF1);
		WriteByte((vcRS4<<6)+vcAR4);
		WriteByte((vcRS2<<6)+vcAR2);
		WriteByte((vcRS3<<6)+vcAR3);
		WriteByte((vcRS1<<6)+vcAR1);
		WriteByte(vcAM4|vcD1R4|vcD1R4Unk);
		WriteByte(vcAM2|vcD1R2|vcD1R2Unk);
		WriteByte(vcAM3|vcD1R3|vcD1R3Unk);
		WriteByte(vcAM1|vcD1R1|vcD1R1Unk);
		WriteByte(vcD2R4);
		WriteByte(vcD2R2);
		WriteByte(vcD2R3);
		WriteByte(vcD2R1);
		WriteByte((vcDL4<<4)+vcRR4);
		WriteByte((vcDL2<<4)+vcRR2);
		WriteByte((vcDL3<<4)+vcRR3);
		WriteByte((vcDL1<<4)+vcRR1);
		WriteByte(vcTL4|vcTLMask4);
		WriteByte(vcTL2|vcTLMask2);
		WriteByte(vcTL3|vcTLMask3);
		WriteByte(vcTL1|vcTLMask1);
	}
	else
	{
		WriteByte((vcDT4<<4)+vcCF4);
		WriteByte((vcDT3<<4)+vcCF3);
		WriteByte((vcDT2<<4)+vcCF2);
		WriteByte((vcDT1<<4)+vcCF1);
		WriteByte((vcRS4<<6)+vcAR4);
		WriteByte((vcRS3<<6)+vcAR3);
		WriteByte((vcRS2<<6)+vcAR2);
		WriteByte((vcRS1<<6)+vcAR1);
		WriteByte(vcAM4|vcD1R4|vcD1R4Unk);
		WriteByte(vcAM3|vcD1R3|vcD1R3Unk);
		WriteByte(vcAM2|vcD1R2|vcD1R2Unk);
		WriteByte(vcAM1|vcD1R1|vcD1R1Unk);
		WriteByte(vcD2R4);
		WriteByte(vcD2R3);
		WriteByte(vcD2R2);
		WriteByte(vcD2R1);
		WriteByte((vcDL4<<4)+vcRR4);
		WriteByte((vcDL3<<4)+vcRR3);
		WriteByte((vcDL2<<4)+vcRR2);
		WriteByte((vcDL1<<4)+vcRR1);
		WriteByte(vcTL4|vcTLMask4);
		WriteByte(vcTL3|vcTLMask3);
		WriteByte(vcTL2|vcTLMask2);
		WriteByte(vcTL1|vcTLMask1);
	}

	++current_voice;
}